

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<Vector2f,_std::allocator<Vector2f>_> *
poly_mul<Vector2f>(vector<Vector2f,_std::allocator<Vector2f>_> *__return_storage_ptr__,
                  vector<Vector2f,_std::allocator<Vector2f>_> *a,Vector2f *b)

{
  Vector2f *pVVar1;
  pointer pVVar2;
  vector<Vector2f,_std::allocator<Vector2f>_> *__range1;
  Vector2f *x;
  Vector2f *v0;
  Vector2f VStack_38;
  
  pVVar1 = (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (v0 = (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
            super__Vector_impl_data._M_start; v0 != pVVar1; v0 = v0 + 1) {
    operator*(v0,b);
    Vector2f::operator=(v0,&VStack_38);
  }
  pVVar2 = (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
  super__Vector_impl_data._M_finish = pVVar2;
  (__return_storage_ptr__->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> poly_mul(std::vector<T> a, Vector2f b) {
	for (auto& x : a) x = x * b;
	return a;
}